

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  ushort uVar1;
  ObjectValues *pOVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char cVar8;
  uint *__s;
  uint *__s_00;
  size_t sVar7;
  
  uVar1 = *(ushort *)&other->field_0x8;
  cVar8 = (char)*(ushort *)&this->field_0x8;
  if (cVar8 != (char)uVar1) goto LAB_00113962;
  switch(cVar8) {
  case '\0':
    bVar3 = true;
    break;
  case '\x01':
  case '\x02':
    bVar3 = (this->value_).int_ == (other->value_).int_;
    break;
  case '\x03':
    bVar3 = (bool)(-((other->value_).real_ == (this->value_).real_) & 1);
    break;
  case '\x04':
    __s = (uint *)(this->value_).string_;
    __s_00 = (uint *)(other->value_).string_;
    if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
      return __s == __s_00;
    }
    if ((*(ushort *)&this->field_0x8 >> 8 & 1) == 0) {
      sVar7 = strlen((char *)__s);
      uVar4 = (uint)sVar7;
    }
    else {
      uVar4 = *__s;
      __s = __s + 1;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      sVar7 = strlen((char *)__s_00);
      uVar5 = (uint)sVar7;
    }
    else {
      uVar5 = *__s_00;
      __s_00 = __s_00 + 1;
    }
    if (uVar4 == uVar5) {
      iVar6 = bcmp(__s,__s_00,(ulong)uVar4);
      return iVar6 == 0;
    }
    goto LAB_00113962;
  case '\x05':
    bVar3 = (this->value_).bool_ == (other->value_).bool_;
    break;
  case '\x06':
  case '\a':
    pOVar2 = (this->value_).map_;
    if ((pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
        (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
      bVar3 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>>
                        ((pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          )&(pOVar2->_M_t)._M_impl.super__Rb_tree_header,
                         (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_left);
      return bVar3;
    }
LAB_00113962:
    bVar3 = false;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Expost[P]SimpleFtpServer/jsoncpp.cpp"
                  ,0xbe2,"bool Json::Value::operator==(const Value &) const");
  }
  return bVar3;
}

Assistant:

bool Value::operator==(const Value& other) const {
  // if ( type_ != other.type_ )
  // GCC 2.95.3 says:
  // attempt to take address of bit-field structure member `Json::Value::type_'
  // Beats me, but a temp solves the problem.
  int temp = other.type_;
  if (type_ != temp)
    return false;
  switch (type_) {
  case nullValue:
    return true;
  case intValue:
    return value_.int_ == other.value_.int_;
  case uintValue:
    return value_.uint_ == other.value_.uint_;
  case realValue:
    return value_.real_ == other.value_.real_;
  case booleanValue:
    return value_.bool_ == other.value_.bool_;
  case stringValue:
  {
    if ((value_.string_ == 0) || (other.value_.string_ == 0)) {
      return (value_.string_ == other.value_.string_);
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    decodePrefixedString(other.allocated_, other.value_.string_, &other_len, &other_str);
    if (this_len != other_len) return false;
    JSON_ASSERT(this_str && other_str);
    int comp = memcmp(this_str, other_str, this_len);
    return comp == 0;
  }
  case arrayValue:
  case objectValue:
    return value_.map_->size() == other.value_.map_->size() &&
           (*value_.map_) == (*other.value_.map_);
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}